

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O0

DispatchCallResult __thiscall
capnp::DynamicCapability::Server::dispatchCall
          (Server *this,uint64_t interfaceId,uint16_t methodId,
          CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  NullableValue<capnp::InterfaceSchema> *other;
  InterfaceSchema *pIVar4;
  Schema *this_00;
  char *pcVar5;
  undefined8 extraout_RDX;
  CallContextHook *in_R8;
  DispatchCallResult DVar6;
  Reader local_1d8;
  ArrayPtr<const_char> local_1a8;
  Reader local_198;
  ArrayPtr<const_char> local_168;
  undefined4 local_154;
  RawBrandedSchema *local_150;
  Schema local_148;
  CallContext<capnp::DynamicStruct,_capnp::DynamicStruct> local_140;
  Schema local_128;
  Schema SStack_120;
  uint16_t local_118;
  undefined6 uStack_116;
  SegmentReader *pSStack_110;
  CapTableReader *local_108;
  void *pvStack_100;
  WirePointer *local_f8;
  StructDataBitCount SStack_f0;
  StructPointerCount SStack_ec;
  undefined2 uStack_ea;
  Schema local_e8;
  StructSchema resultType;
  Method method;
  MethodList methods;
  InterfaceSchema *interface;
  Maybe<capnp::InterfaceSchema> local_50;
  undefined1 local_40 [8];
  NullableValue<capnp::InterfaceSchema> _interface61;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  
  _interface61.field_1._6_2_ = SUB82(context.hook,0);
  InterfaceSchema::findSuperclass((InterfaceSchema *)&local_50,interfaceId + 0x10);
  other = kj::_::readMaybe<capnp::InterfaceSchema>(&local_50);
  kj::_::NullableValue<capnp::InterfaceSchema>::NullableValue
            ((NullableValue<capnp::InterfaceSchema> *)local_40,other);
  kj::Maybe<capnp::InterfaceSchema>::~Maybe(&local_50);
  pIVar4 = kj::_::NullableValue::operator_cast_to_InterfaceSchema_((NullableValue *)local_40);
  if (pIVar4 == (InterfaceSchema *)0x0) {
    Schema::getProto(&local_1d8,(Schema *)(interfaceId + 0x10));
    local_1a8 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_1d8);
    pcVar5 = kj::StringPtr::cStr((StringPtr *)&local_1a8);
    Capability::Server::internalUnimplemented
              (&this->super_Server,(char *)interfaceId,(uint64_t)pcVar5);
  }
  else {
    this_00 = &kj::_::NullableValue<capnp::InterfaceSchema>::operator*
                         ((NullableValue<capnp::InterfaceSchema> *)local_40)->super_Schema;
    InterfaceSchema::getMethods
              ((MethodList *)&method.proto._reader.nestingLimit,(InterfaceSchema *)this_00);
    uVar2 = (uint)(ushort)_interface61.field_1._6_2_;
    uVar3 = InterfaceSchema::MethodList::size((MethodList *)&method.proto._reader.nestingLimit);
    if (uVar2 < uVar3) {
      InterfaceSchema::MethodList::operator[]
                ((Method *)&resultType,(MethodList *)&method.proto._reader.nestingLimit,
                 (uint)(ushort)_interface61.field_1._6_2_);
      local_e8.raw = (RawBrandedSchema *)
                     InterfaceSchema::Method::getResultType((Method *)&resultType);
      local_f8 = method.proto._reader.pointers;
      SStack_f0 = method.proto._reader.dataSize;
      SStack_ec = method.proto._reader.pointerCount;
      uStack_ea = method.proto._reader._38_2_;
      local_108 = method.proto._reader.capTable;
      pvStack_100 = method.proto._reader.data;
      local_118 = method.ordinal;
      uStack_116 = method._10_6_;
      pSStack_110 = method.proto._reader.segment;
      local_128 = resultType.super_Schema.raw;
      SStack_120 = method.parent.super_Schema.raw;
      local_148.raw =
           (RawBrandedSchema *)InterfaceSchema::Method::getParamType((Method *)&resultType);
      local_150 = local_e8.raw;
      CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::CallContext
                (&local_140,in_R8,(StructSchema)local_148.raw,(StructSchema)local_e8.raw);
      (**(code **)(*(long *)interfaceId + 0x18))(this);
      bVar1 = StructSchema::isStreamResult((StructSchema *)&local_e8);
      *(bool *)&(this->super_Server).thisHook.ptr = bVar1;
      *(byte *)((long)&(this->super_Server).thisHook.ptr + 1) = *(byte *)(interfaceId + 0x18) & 1;
    }
    else {
      Schema::getProto(&local_198,this_00);
      local_168 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_198);
      pcVar5 = kj::StringPtr::cStr((StringPtr *)&local_168);
      Capability::Server::internalUnimplemented
                (&this->super_Server,(char *)interfaceId,(uint64_t)pcVar5,methodId);
    }
  }
  local_154 = 1;
  kj::_::NullableValue<capnp::InterfaceSchema>::~NullableValue
            ((NullableValue<capnp::InterfaceSchema> *)local_40);
  DVar6.isStreaming = (bool)(char)extraout_RDX;
  DVar6.allowCancellation = (bool)(char)((ulong)extraout_RDX >> 8);
  DVar6._10_6_ = (int6)((ulong)extraout_RDX >> 0x10);
  DVar6.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar6;
}

Assistant:

Capability::Server::DispatchCallResult DynamicCapability::Server::dispatchCall(
    uint64_t interfaceId, uint16_t methodId,
    CallContext<AnyPointer, AnyPointer> context) {
  KJ_IF_SOME(interface, schema.findSuperclass(interfaceId)) {
    auto methods = interface.getMethods();
    if (methodId < methods.size()) {
      auto method = methods[methodId];
      auto resultType = method.getResultType();
      return {
        call(method, CallContext<DynamicStruct, DynamicStruct>(*context.hook,
            method.getParamType(), resultType)),
        resultType.isStreamResult(),
        options.allowCancellation
      };
    } else {
      return internalUnimplemented(
          interface.getProto().getDisplayName().cStr(), interfaceId, methodId);
    }
  } else {
    return internalUnimplemented(schema.getProto().getDisplayName().cStr(), interfaceId);
  }